

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  cmOutputConverter *this_00;
  pointer ppcVar1;
  cmMakefile *pcVar2;
  cmLocalGenerator *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmGlobalUnixMakefileGenerator3 *this_01;
  pointer source;
  uint uVar6;
  string *source_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  string check;
  string tmpStr;
  string cache;
  string local_2d8;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  
  pcVar4 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
  std::__cxx11::string::string((string *)&cmakefileName,pcVar4,(allocator *)&cmakefileStream);
  std::__cxx11::string::append((char *)&cmakefileName);
  std::__cxx11::string::append((char *)&cmakefileName);
  cmGeneratedFileStream::cmGeneratedFileStream
            (&cmakefileStream,cmakefileName._M_dataplus._M_p,false);
  if (((&cmakefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
         field_0x20)
       [(long)cmakefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar4 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
    std::__cxx11::string::string((string *)&makefileName,pcVar4,(allocator *)&cache);
    std::__cxx11::string::append((char *)&makefileName);
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              ((cmLocalUnixMakefileGenerator3 *)
               *(this->super_cmGlobalGenerator).LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start,(ostream *)&cmakefileStream);
    poVar5 = std::operator<<((ostream *)&cmakefileStream,"# The generator used is:\n");
    poVar5 = std::operator<<(poVar5,"set(CMAKE_DEPENDS_GENERATOR \"");
    (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[2])(&cache);
    poVar5 = std::operator<<(poVar5,(string *)&cache);
    std::operator<<(poVar5,"\")\n\n");
    std::__cxx11::string::~string((string *)&cache);
    lfiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lfiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lfiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = 0;
    while( true ) {
      ppcVar1 = (this->super_cmGlobalGenerator).LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_cmGlobalGenerator).LocalGenerators.
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
          (ulong)uVar6) break;
      pcVar2 = ppcVar1[uVar6]->Makefile;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lfiles,
                 (const_iterator)
                 lfiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (pcVar2->ListFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pcVar2->ListFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      uVar6 = uVar6 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
              (lfiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               lfiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (lfiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         lfiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&lfiles,(const_iterator)__first._M_current,
            (const_iterator)
            lfiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
    pcVar3 = *(this->super_cmGlobalGenerator).LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar4 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
    std::__cxx11::string::string((string *)&cache,pcVar4,(allocator *)&check);
    std::__cxx11::string::append((char *)&cache);
    poVar5 = std::operator<<((ostream *)&cmakefileStream,
                             "# The top level Makefile was generated from the following files:\n");
    poVar5 = std::operator<<(poVar5,"set(CMAKE_MAKEFILE_DEPENDS\n");
    poVar5 = std::operator<<(poVar5,"  \"");
    this_00 = &pcVar3->super_cmOutputConverter;
    cmOutputConverter::Convert(&check,this_00,&cache,START_OUTPUT,UNCHANGED);
    poVar5 = std::operator<<(poVar5,(string *)&check);
    std::operator<<(poVar5,"\"\n");
    std::__cxx11::string::~string((string *)&check);
    for (source = lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        source != lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
      poVar5 = std::operator<<((ostream *)&cmakefileStream,"  \"");
      cmOutputConverter::Convert(&check,this_00,source,START_OUTPUT,UNCHANGED);
      poVar5 = std::operator<<(poVar5,(string *)&check);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&check);
    }
    std::operator<<((ostream *)&cmakefileStream,"  )\n\n");
    pcVar4 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
    std::__cxx11::string::string((string *)&check,pcVar4,(allocator *)&tmpStr);
    std::__cxx11::string::append((char *)&check);
    std::__cxx11::string::append((char *)&check);
    poVar5 = std::operator<<((ostream *)&cmakefileStream,"# The corresponding makefile is:\n");
    poVar5 = std::operator<<(poVar5,"set(CMAKE_MAKEFILE_OUTPUTS\n");
    poVar5 = std::operator<<(poVar5,"  \"");
    cmOutputConverter::Convert(&tmpStr,this_00,&makefileName,START_OUTPUT,UNCHANGED);
    poVar5 = std::operator<<(poVar5,(string *)&tmpStr);
    poVar5 = std::operator<<(poVar5,"\"\n");
    poVar5 = std::operator<<(poVar5,"  \"");
    cmOutputConverter::Convert(&local_2d8,this_00,&check,START_OUTPUT,UNCHANGED);
    poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
    std::operator<<(poVar5,"\"\n");
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&tmpStr);
    std::operator<<((ostream *)&cmakefileStream,"  )\n\n");
    poVar5 = std::operator<<((ostream *)&cmakefileStream,"# Byproducts of CMake generate step:\n");
    std::operator<<(poVar5,"set(CMAKE_MAKEFILE_PRODUCTS\n");
    pcVar2 = pcVar3->Makefile;
    for (source_00 = (pcVar2->OutputFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        source_00 !=
        (pcVar2->OutputFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; source_00 = source_00 + 1) {
      poVar5 = std::operator<<((ostream *)&cmakefileStream,"  \"");
      cmOutputConverter::Convert(&tmpStr,this_00,source_00,HOME_OUTPUT,UNCHANGED);
      poVar5 = std::operator<<(poVar5,(string *)&tmpStr);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&tmpStr);
    }
    tmpStr._M_dataplus._M_p = (pointer)&tmpStr.field_2;
    tmpStr._M_string_length = 0;
    tmpStr.field_2._M_local_buf[0] = '\0';
    uVar6 = 0;
    while( true ) {
      ppcVar1 = (this->super_cmGlobalGenerator).LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_cmGlobalGenerator).LocalGenerators.
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
          (ulong)uVar6) break;
      pcVar3 = ppcVar1[uVar6];
      cmMakefile::GetCurrentBinaryDirectory(pcVar3->Makefile);
      std::__cxx11::string::assign((char *)&tmpStr);
      std::__cxx11::string::append((char *)&tmpStr);
      std::__cxx11::string::append((char *)&tmpStr);
      poVar5 = std::operator<<((ostream *)&cmakefileStream,"  \"");
      cmOutputConverter::Convert
                (&local_2d8,&pcVar3->super_cmOutputConverter,&tmpStr,HOME_OUTPUT,UNCHANGED);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      std::operator<<(poVar5,"\"\n");
      std::__cxx11::string::~string((string *)&local_2d8);
      uVar6 = uVar6 + 1;
    }
    std::operator<<((ostream *)&cmakefileStream,"  )\n\n");
    this_01 = (cmGlobalUnixMakefileGenerator3 *)&tmpStr;
    std::__cxx11::string::~string((string *)this_01);
    WriteMainCMakefileLanguageRules
              (this_01,&cmakefileStream,&(this->super_cmGlobalGenerator).LocalGenerators);
    std::__cxx11::string::~string((string *)&check);
    std::__cxx11::string::~string((string *)&cache);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lfiles);
    std::__cxx11::string::~string((string *)&makefileName);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&cmakefileStream);
  std::__cxx11::string::~string((string *)&cmakefileName);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += cmake::GetCMakeFilesDirectory();
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName.c_str());
  if(!cmakefileStream)
    {
    return;
    }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3 *lg =
    static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream
    << "# The generator used is:\n"
    << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName() << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);

    // Get the list of files contributing to this generation step.
    lfiles.insert(lfiles.end(),lg->GetMakefile()->GetListFiles().begin(),
                  lg->GetMakefile()->GetListFiles().end());
    }
  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(),lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Build the path to the cache file.
  std::string cache = this->GetCMakeInstance()->GetHomeOutputDirectory();
  cache += "/CMakeCache.txt";

  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \""
    << lg->Convert(cache,
                   cmLocalGenerator::START_OUTPUT) << "\"\n";
  for(std::vector<std::string>::const_iterator i = lfiles.begin();
      i !=  lfiles.end(); ++i)
    {
    cmakefileStream
      << "  \""
      << lg->Convert(*i, cmLocalGenerator::START_OUTPUT)
      << "\"\n";
    }
  cmakefileStream
    << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += cmake::GetCMakeFilesDirectory();
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream
    << "# The corresponding makefile is:\n"
    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
    << "  \""
    << lg->Convert(makefileName,
                   cmLocalGenerator::START_OUTPUT) << "\"\n"
    << "  \""
    << lg->Convert(check,
                   cmLocalGenerator::START_OUTPUT) << "\"\n";
  cmakefileStream << "  )\n\n";

  // CMake must rerun if a byproduct is missing.
  {
  cmakefileStream
    << "# Byproducts of CMake generate step:\n"
    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
  const std::vector<std::string>& outfiles =
    lg->GetMakefile()->GetOutputFiles();
  for(std::vector<std::string>::const_iterator k = outfiles.begin();
      k != outfiles.end(); ++k)
    {
    cmakefileStream << "  \"" <<
      lg->Convert(*k,cmLocalGenerator::HOME_OUTPUT)
                    << "\"\n";
    }

  // add in all the directory information files
  std::string tmpStr;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);
    tmpStr = lg->GetMakefile()->GetCurrentBinaryDirectory();
    tmpStr += cmake::GetCMakeFilesDirectory();
    tmpStr += "/CMakeDirectoryInformation.cmake";
    cmakefileStream << "  \"" <<
      lg->Convert(tmpStr,cmLocalGenerator::HOME_OUTPUT)
                    << "\"\n";
    }
  cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}